

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall Array::getData(Array *this,int x,int y,int *res)

{
  bool bVar1;
  
  bVar1 = false;
  if ((((-1 < x) && (-1 < y)) && (x < this->_width)) && (y < this->_height)) {
    *res = this->_data[(uint)y][(uint)x];
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Array::getData(int x, int y, int& res)
{
	if (x < 0 || x >= _width
		|| y < 0 || y >= _height)
		return false;

	res = _data[y][x];

	return true;
}